

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigUnfold2.c
# Opt level: O2

Vec_Vec_t *
Ssw_ManFindDirectImplications2(Aig_Man_t *p,int nFrames,int nConfs,int nProps,int fVerbose)

{
  Aig_Obj_t *pAVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  Vec_Vec_t *p_00;
  Aig_Man_t *p_01;
  Cnf_Dat_t *p_02;
  sat_solver *s;
  Aig_Obj_t *pObj;
  Aig_Obj_t *pAVar5;
  Vec_Ptr_t *pVVar6;
  int *piVar7;
  long lVar8;
  uint uVar9;
  
  piVar7 = (int *)(ulong)(uint)nProps;
  if (nFrames != 1) {
    __assert_fail("nFrames == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/saig/saigUnfold2.c"
                  ,0xce,"Vec_Vec_t *Ssw_ManFindDirectImplications2(Aig_Man_t *, int, int, int, int)"
                 );
  }
  p_00 = Vec_VecAlloc(1);
  p_01 = Saig_ManUnrollCOI(p,1);
  if (p_01->nObjs[3] == 1) {
    p_02 = Cnf_DeriveSimple(p_01,0);
    s = (sat_solver *)Cnf_DataWriteIntoSolver(p_02,1,0);
    if (s != (sat_solver *)0x0) {
      Aig_ManIncrementTravId(p);
      for (lVar8 = 0; lVar8 < p->vObjs->nSize; lVar8 = lVar8 + 1) {
        pObj = (Aig_Obj_t *)Vec_PtrEntry(p->vObjs,(int)lVar8);
        if (pObj != (Aig_Obj_t *)0x0) {
          iVar2 = Aig_ObjIsCand(pObj);
          if ((iVar2 != 0) && (pObj->TravId != p->nTravIds)) {
            pAVar1 = p->pObjCopies[lVar8];
            piVar7 = p_02->pVarNums;
            if (-1 < piVar7[*(int *)(((ulong)pAVar1 & 0xfffffffffffffffe) + 0x24)]) {
              iVar2 = sat_solver_get_var_value
                                (s,piVar7[*(int *)(((ulong)pAVar1 & 0xfffffffffffffffe) + 0x24)]);
              if (iVar2 != 0) {
                pObj->TravId = p->nTravIds;
                iVar3 = Saig_ObjIsLo(p,pObj);
                if (iVar3 != 0) {
                  pAVar5 = Saig_ObjLoToLi(p,pObj);
                  piVar7 = (int *)(ulong)(uint)p->nTravIds;
                  *(int *)(((ulong)pAVar5->pFanin0 & 0xfffffffffffffffe) + 0x20) = p->nTravIds;
                }
                Vec_VecPush(p_00,0,(void *)((ulong)((uint)pAVar1 & 1) ^ (ulong)pObj ^
                                           (ulong)(iVar2 == 1)));
              }
            }
          }
        }
      }
      sat_solver_delete(s);
    }
    Aig_ManStop(p_01);
    Cnf_DataFree(p_02);
    iVar2 = (int)piVar7;
    if (fVerbose != 0) {
      uVar4 = Vec_VecSizeSize(p_00);
      printf("Found %3d candidates.\n",(ulong)uVar4);
      uVar4 = p_00->nSize;
      if ((int)uVar4 < 1) {
        uVar4 = 0;
      }
      for (uVar9 = 0; iVar2 = (int)piVar7, uVar4 != uVar9; uVar9 = uVar9 + 1) {
        pVVar6 = Vec_VecEntry(p_00,uVar9);
        printf("Level %d. Cands  =%d    ",(ulong)uVar9,(ulong)(uint)pVVar6->nSize);
        putchar(10);
      }
    }
    if (p->pObjCopies != (Aig_Obj_t **)0x0) {
      free(p->pObjCopies);
      p->pObjCopies = (Aig_Obj_t **)0x0;
    }
    Saig_ManFilterUsingInd2(p,p_00,nConfs,iVar2,fVerbose);
    iVar2 = Vec_VecSizeSize(p_00);
    if (iVar2 != 0) {
      uVar4 = Vec_VecSizeSize(p_00);
      printf("Found %3d constraints after filtering.\n",(ulong)uVar4);
    }
    if (fVerbose != 0) {
      uVar4 = p_00->nSize;
      if (p_00->nSize < 1) {
        uVar4 = 0;
      }
      for (uVar9 = 0; uVar4 != uVar9; uVar9 = uVar9 + 1) {
        pVVar6 = Vec_VecEntry(p_00,uVar9);
        printf("Level %d. Constr =%d    ",(ulong)uVar9,(ulong)(uint)pVVar6->nSize);
        putchar(10);
      }
    }
    return p_00;
  }
  __assert_fail("Aig_ManCoNum(pFrames) == 1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/saig/saigUnfold2.c"
                ,0xd3,"Vec_Vec_t *Ssw_ManFindDirectImplications2(Aig_Man_t *, int, int, int, int)");
}

Assistant:

Vec_Vec_t * Ssw_ManFindDirectImplications2( Aig_Man_t * p, int nFrames, int nConfs, int nProps, int fVerbose )
{
  Vec_Vec_t * vCands = NULL;
  Vec_Ptr_t * vNodes;
  Cnf_Dat_t * pCnf;
  sat_solver * pSat;
  Aig_Man_t * pFrames;
  Aig_Obj_t * pObj, * pRepr, * pReprR;
  int i, f, k, value;
  assert(nFrames == 1);
  vCands = Vec_VecAlloc( nFrames );
  assert(nFrames == 1);
  // perform unrolling
  pFrames = Saig_ManUnrollCOI( p, nFrames );
  assert( Aig_ManCoNum(pFrames) == 1 );
  // start the SAT solver
  pCnf = Cnf_DeriveSimple( pFrames, 0 );
  pSat = (sat_solver *)Cnf_DataWriteIntoSolver( pCnf, 1, 0 );
  if ( pSat != NULL )
    {
      Aig_ManIncrementTravId( p );
      for ( f = 0; f < nFrames; f++ )
        {
          Aig_ManForEachObj( p, pObj, i )
            {
              if ( !Aig_ObjIsCand(pObj) )
                continue;
              //--jlong : also use internal nodes as well
              /* if ( !Aig_ObjIsCi(pObj) ) */
              /*   continue; */ 
              if ( Aig_ObjIsTravIdCurrent(p, pObj) )
                continue;
              // get the node from timeframes
              pRepr  = p->pObjCopies[nFrames*i + nFrames-1-f];
              pReprR = Aig_Regular(pRepr);
              if ( pCnf->pVarNums[Aig_ObjId(pReprR)] < 0 )
                continue;
              //                value = pSat->assigns[ pCnf->pVarNums[Aig_ObjId(pReprR)] ];
              value = sat_solver_get_var_value( pSat, pCnf->pVarNums[Aig_ObjId(pReprR)] );
              if ( value == l_Undef )
                continue;
              // label this node as taken
              Aig_ObjSetTravIdCurrent(p, pObj);
              if ( Saig_ObjIsLo(p, pObj) )
                Aig_ObjSetTravIdCurrent( p, Aig_ObjFanin0(Saig_ObjLoToLi(p, pObj)) );
              // remember the node
              Vec_VecPush( vCands, f, Aig_NotCond( pObj, (value == l_True) ^ Aig_IsComplement(pRepr) ) );
              //        printf( "%s%d ", (value == l_False)? "":"!", i );
            }
        }
      //    printf( "\n" );
      sat_solver_delete( pSat );
    }
  Aig_ManStop( pFrames );
  Cnf_DataFree( pCnf );

  if ( fVerbose )
    {
      printf( "Found %3d candidates.\n", Vec_VecSizeSize(vCands) );
      Vec_VecForEachLevel( vCands, vNodes, k )
        {
          printf( "Level %d. Cands  =%d    ", k, Vec_PtrSize(vNodes) );
          //            Vec_PtrForEachEntry( Aig_Obj_t *, vNodes, pObj, i )
          //                printf( "%d:%s%d ", k, Aig_IsComplement(pObj)? "!":"", Aig_ObjId(Aig_Regular(pObj)) );
          printf( "\n" );
        }
    }

  ABC_FREE( p->pObjCopies );
  /* -- jlong -- this does the SAT proof of the constraints */
  Saig_ManFilterUsingInd2( p, vCands, nConfs, nProps, fVerbose );
  if ( Vec_VecSizeSize(vCands) )
    printf( "Found %3d constraints after filtering.\n", Vec_VecSizeSize(vCands) );
  if ( fVerbose )
    {
      Vec_VecForEachLevel( vCands, vNodes, k )
        {
          printf( "Level %d. Constr =%d    ", k, Vec_PtrSize(vNodes) );
          //            Vec_PtrForEachEntry( Aig_Obj_t *, vNodes, pObj, i )
          //                printf( "%d:%s%d ", k, Aig_IsComplement(pObj)? "!":"", Aig_ObjId(Aig_Regular(pObj)) );
          printf( "\n" );
        }
    }
  
  return vCands;
}